

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

uint mjs::get_hex_value(int ch)

{
  runtime_error *this;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = ch - 0x30;
  if (9 < uVar1) {
    if (ch - 0x41U < 6) {
      uVar1 = ch - 0x37;
    }
    else {
      if (5 < ch - 0x61U) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
        std::operator+(&local_40,"Invalid hex digit: ",&local_60);
        std::runtime_error::runtime_error(this,(string *)&local_40);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar1 = ch - 0x57;
    }
  }
  return uVar1;
}

Assistant:

unsigned get_hex_value(int ch) {
    if (is_digit(ch)) return ch - '0';
    if (ch >= 'A' && ch <= 'F') return ch - 'A' + 10;
    if (ch >= 'a' && ch <= 'f') return ch - 'a' + 10;
    throw std::runtime_error("Invalid hex digit: " + std::string(1, (char)ch));
}